

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.h
# Opt level: O3

uint64_t sentencepiece::bpe::Trainer::EncodePos(int sid,int l,int r)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (l < 0) {
    uStack_28._0_7_ = (undefined7)in_RAX;
    uStack_28 = CONCAT17(1,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bpe_model_trainer.h",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(l) >= (0)",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
    error::Die::~Die((Die *)((long)&uStack_28 + 7));
  }
  if (r < 0) {
    uStack_28._0_7_ = CONCAT16(1,(undefined6)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bpe_model_trainer.h",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(r) >= (0)",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
    error::Die::~Die((Die *)((long)&uStack_28 + 6));
  }
  if (0xffff < l) {
    uStack_28._0_6_ = CONCAT15(1,(undefined5)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bpe_model_trainer.h",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"(l) <= (std::numeric_limits<uint16_t>::max())",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
    error::Die::~Die((Die *)((long)&uStack_28 + 5));
  }
  if (0xffff < r) {
    uStack_28._0_5_ = CONCAT14(1,(undefined4)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"bpe_model_trainer.h",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x49);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"(r) <= (std::numeric_limits<uint16_t>::max())",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
    error::Die::~Die((Die *)((long)&uStack_28 + 4));
  }
  return (long)r | (ulong)(uint)sid << 0x20 | (long)l << 0x10;
}

Assistant:

static uint64_t EncodePos(int sid, int l, int r) {
    CHECK_GE(l, 0);
    CHECK_GE(r, 0);
    CHECK_LE(l, std::numeric_limits<uint16_t>::max());
    CHECK_LE(r, std::numeric_limits<uint16_t>::max());
    const uint64_t n = (static_cast<uint64_t>(sid) << 32) |
                       (static_cast<uint64_t>(l) << 16) | r;
    return n;
  }